

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

bool __thiscall flatbuffers::rust::RustGenerator::GenerateOneFile(RustGenerator *this)

{
  StructDef *pSVar1;
  bool bVar2;
  char *pcVar3;
  reference ppEVar4;
  reference ppSVar5;
  undefined1 local_180 [8];
  string final_code;
  string file_path;
  StructDef *struct_def_2;
  StructDef *struct_def_1;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_128;
  const_iterator it_2;
  StructDef *struct_def;
  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
  local_110;
  const_iterator it_1;
  EnumDef *enum_def;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_f8;
  const_iterator it;
  Namespace **ns;
  __normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
  local_e0;
  const_iterator ns_it;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  RustGenerator *local_10;
  RustGenerator *this_local;
  
  local_10 = this;
  CodeWriter::Clear(&this->code_);
  pcVar3 = BaseGenerator::FlatBuffersGeneratedWarning();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,pcVar3,&local_71);
  std::operator+(&local_50,"// ",&local_70);
  std::operator+(&local_30,&local_50,"\n\n");
  CodeWriter::operator+=(&this->code_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"// @generated",&local_a9);
  CodeWriter::operator+=(&this->code_,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  if (this->cur_name_space_ == (Namespace *)0x0) {
    GenNamespaceImports(this,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"",(allocator<char> *)((long)&ns_it._M_current + 7));
    CodeWriter::operator+=(&this->code_,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&ns_it._M_current + 7));
    local_e0._M_current =
         (Namespace **)
         std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::begin
                   (&((this->super_BaseGenerator).parser_)->namespaces_);
    while( true ) {
      ns = (Namespace **)
           std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::end
                     (&((this->super_BaseGenerator).parser_)->namespaces_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_e0,
                         (__normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
                          *)&ns);
      if (!bVar2) break;
      it._M_current =
           (EnumDef **)
           __gnu_cxx::
           __normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
           ::operator*(&local_e0);
      local_f8._M_current =
           (EnumDef **)
           std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                     (&(((this->super_BaseGenerator).parser_)->enums_).vec);
      while( true ) {
        enum_def = (EnumDef *)
                   std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                             (&(((this->super_BaseGenerator).parser_)->enums_).vec);
        bVar2 = __gnu_cxx::operator!=
                          (&local_f8,
                           (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                            *)&enum_def);
        if (!bVar2) break;
        ppEVar4 = __gnu_cxx::
                  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                  ::operator*(&local_f8);
        it_1._M_current = (StructDef **)*ppEVar4;
        if (((EnumDef *)(((EnumDef *)it_1._M_current)->super_Definition).defined_namespace ==
             *it._M_current) &&
           (((((EnumDef *)it_1._M_current)->super_Definition).generated & 1U) == 0)) {
          SetNameSpace(this,(((EnumDef *)it_1._M_current)->super_Definition).defined_namespace);
          GenEnum(this,(EnumDef *)it_1._M_current);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
        ::operator++(&local_f8);
      }
      local_110._M_current =
           (StructDef **)
           std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                     (&(((this->super_BaseGenerator).parser_)->structs_).vec);
      while( true ) {
        struct_def = (StructDef *)
                     std::
                     vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                     end(&(((this->super_BaseGenerator).parser_)->structs_).vec);
        bVar2 = __gnu_cxx::operator!=
                          (&local_110,
                           (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                            *)&struct_def);
        if (!bVar2) break;
        ppSVar5 = __gnu_cxx::
                  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                  ::operator*(&local_110);
        it_2._M_current = (StructDef **)*ppSVar5;
        if ((((EnumDef *)(((StructDef *)it_2._M_current)->super_Definition).defined_namespace ==
              *it._M_current) && ((((StructDef *)it_2._M_current)->fixed & 1U) != 0)) &&
           (((((StructDef *)it_2._M_current)->super_Definition).generated & 1U) == 0)) {
          SetNameSpace(this,(((StructDef *)it_2._M_current)->super_Definition).defined_namespace);
          GenStruct(this,(StructDef *)it_2._M_current);
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
        ::operator++(&local_110);
      }
      local_128._M_current =
           (StructDef **)
           std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::begin
                     (&(((this->super_BaseGenerator).parser_)->structs_).vec);
      while( true ) {
        struct_def_1 = (StructDef *)
                       std::
                       vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>::
                       end(&(((this->super_BaseGenerator).parser_)->structs_).vec);
        bVar2 = __gnu_cxx::operator!=
                          (&local_128,
                           (__normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                            *)&struct_def_1);
        if (!bVar2) break;
        ppSVar5 = __gnu_cxx::
                  __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
                  ::operator*(&local_128);
        pSVar1 = *ppSVar5;
        if ((((EnumDef *)(pSVar1->super_Definition).defined_namespace == *it._M_current) &&
            ((pSVar1->fixed & 1U) == 0)) && (((pSVar1->super_Definition).generated & 1U) == 0)) {
          SetNameSpace(this,(pSVar1->super_Definition).defined_namespace);
          GenTable(this,pSVar1);
          if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
            GenTableObject(this,pSVar1);
          }
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::StructDef_*const_*,_std::vector<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>_>
        ::operator++(&local_128);
      }
      if ((((this->super_BaseGenerator).parser_)->root_struct_def_ != (StructDef *)0x0) &&
         (pSVar1 = ((this->super_BaseGenerator).parser_)->root_struct_def_,
         (EnumDef *)(pSVar1->super_Definition).defined_namespace == *it._M_current)) {
        SetNameSpace(this,(pSVar1->super_Definition).defined_namespace);
        GenRootTableFuncs(this,pSVar1);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::Namespace_*const_*,_std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>_>
      ::operator++(&local_e0);
    }
    if (this->cur_name_space_ != (Namespace *)0x0) {
      SetNameSpace(this,(Namespace *)0x0);
    }
    BaseGenerator::GeneratedFileName
              ((string *)((long)&final_code.field_2 + 8),&this->super_BaseGenerator,
               (this->super_BaseGenerator).path_,(this->super_BaseGenerator).file_name_,
               &((this->super_BaseGenerator).parser_)->opts);
    CodeWriter::ToString_abi_cxx11_((string *)local_180,&this->code_);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = SaveFile(pcVar3,(string *)local_180,false);
    std::__cxx11::string::~string((string *)local_180);
    std::__cxx11::string::~string((string *)(final_code.field_2._M_local_buf + 8));
    return bVar2;
  }
  __assert_fail("!cur_name_space_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_rust.cpp"
                ,0x1b4,"bool flatbuffers::rust::RustGenerator::GenerateOneFile()");
}

Assistant:

bool GenerateOneFile() {
    code_.Clear();
    code_ += "// " + std::string(FlatBuffersGeneratedWarning()) + "\n\n";
    code_ += "// @generated";

    assert(!cur_name_space_);

    // Generate imports for the global scope in case no namespace is used
    // in the schema file.
    GenNamespaceImports(0);
    code_ += "";

    // Generate all code in their namespaces, once, because Rust does not
    // permit re-opening modules.
    //
    // TODO(rw): Use a set data structure to reduce namespace evaluations from
    //           O(n**2) to O(n).
    for (auto ns_it = parser_.namespaces_.begin();
         ns_it != parser_.namespaces_.end(); ++ns_it) {
      const auto &ns = *ns_it;

      // Generate code for all the enum declarations.
      for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
           ++it) {
        const auto &enum_def = **it;
        if (enum_def.defined_namespace == ns && !enum_def.generated) {
          SetNameSpace(enum_def.defined_namespace);
          GenEnum(enum_def);
        }
      }

      // Generate code for all structs.
      for (auto it = parser_.structs_.vec.begin();
           it != parser_.structs_.vec.end(); ++it) {
        const auto &struct_def = **it;
        if (struct_def.defined_namespace == ns && struct_def.fixed &&
            !struct_def.generated) {
          SetNameSpace(struct_def.defined_namespace);
          GenStruct(struct_def);
        }
      }

      // Generate code for all tables.
      for (auto it = parser_.structs_.vec.begin();
           it != parser_.structs_.vec.end(); ++it) {
        const auto &struct_def = **it;
        if (struct_def.defined_namespace == ns && !struct_def.fixed &&
            !struct_def.generated) {
          SetNameSpace(struct_def.defined_namespace);
          GenTable(struct_def);
          if (parser_.opts.generate_object_based_api) {
            GenTableObject(struct_def);
          }
        }
      }

      // Generate global helper functions.
      if (parser_.root_struct_def_) {
        auto &struct_def = *parser_.root_struct_def_;
        if (struct_def.defined_namespace != ns) { continue; }
        SetNameSpace(struct_def.defined_namespace);
        GenRootTableFuncs(struct_def);
      }
    }
    if (cur_name_space_) SetNameSpace(nullptr);

    const auto file_path = GeneratedFileName(path_, file_name_, parser_.opts);
    const auto final_code = code_.ToString();
    return SaveFile(file_path.c_str(), final_code, false);
  }